

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O3

void __thiscall
QFSFileEnginePrivate::QFSFileEnginePrivate(QFSFileEnginePrivate *this,QAbstractFileEngine *q)

{
  (this->super_QAbstractFileEnginePrivate).fileError = UnspecifiedError;
  (this->super_QAbstractFileEnginePrivate).errorString.d.d = (Data *)0x0;
  (this->super_QAbstractFileEnginePrivate).errorString.d.ptr = (char16_t *)0x0;
  (this->super_QAbstractFileEnginePrivate).errorString.d.size = 0;
  (this->super_QAbstractFileEnginePrivate).q_ptr = q;
  (this->super_QAbstractFileEnginePrivate)._vptr_QAbstractFileEnginePrivate =
       (_func_int **)&PTR__QFSFileEnginePrivate_001dbec0;
  QFileSystemEntry::QFileSystemEntry(&this->fileEntry);
  (this->metaData).knownFlagsMask = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->metaData).entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->metaData).size_ = -1;
  (this->metaData).accessTime_ = 0;
  (this->metaData).birthTime_ = 0;
  (this->metaData).metadataChangeTime_ = 0;
  (this->metaData).modificationTime_ = 0;
  (this->metaData).userId_ = 0xfffffffe;
  (this->metaData).groupId_ = 0xfffffffe;
  this->field_0xc2 = this->field_0xc2 & 0xe0 | 8;
  (this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
  this->fd = -1;
  this->lastIOCommand = IOFlushCommand;
  this->fh = (FILE *)0x0;
  (this->maps).d = (Data *)0x0;
  this->lastFlushFailed = false;
  this->closeFileHandle = false;
  return;
}

Assistant:

QFSFileEnginePrivate::QFSFileEnginePrivate(QAbstractFileEngine *q)
    : QAbstractFileEnginePrivate(q)
{
    init();
}